

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<capnp::EzRpcServer::Impl> __thiscall
kj::
heap<capnp::EzRpcServer::Impl,capnp::Capability::Client,sockaddr*&,unsigned_int&,capnp::ReaderOptions&>
          (kj *this,Client *params,sockaddr **params_1,uint *params_2,ReaderOptions *params_3)

{
  uint addrSize;
  sockaddr *bindAddress;
  undefined8 uVar1;
  undefined4 uVar2;
  Impl *this_00;
  Client *pCVar3;
  sockaddr **ppsVar4;
  uint *puVar5;
  ReaderOptions *pRVar6;
  Impl *extraout_RDX;
  Own<capnp::EzRpcServer::Impl> OVar7;
  ReaderOptions readerOpts;
  Client local_40;
  ReaderOptions *local_30;
  ReaderOptions *params_local_3;
  uint *params_local_2;
  sockaddr **params_local_1;
  Client *params_local;
  
  local_30 = params_3;
  params_local_3 = (ReaderOptions *)params_2;
  params_local_2 = (uint *)params_1;
  params_local_1 = (sockaddr **)params;
  params_local = (Client *)this;
  this_00 = (Impl *)operator_new(0x98);
  pCVar3 = fwd<capnp::Capability::Client>((NoInfer<capnp::Capability::Client> *)params_local_1);
  capnp::Capability::Client::Client(&local_40,pCVar3);
  ppsVar4 = fwd<sockaddr*&>((sockaddr **)params_local_2);
  bindAddress = *ppsVar4;
  puVar5 = fwd<unsigned_int&>((uint *)params_local_3);
  addrSize = *puVar5;
  pRVar6 = fwd<capnp::ReaderOptions&>(local_30);
  uVar1 = pRVar6->traversalLimitInWords;
  uVar2 = pRVar6->nestingLimit;
  readerOpts.nestingLimit = uVar2;
  readerOpts.traversalLimitInWords = uVar1;
  readerOpts._12_4_ = 0;
  capnp::EzRpcServer::Impl::Impl(this_00,&local_40,bindAddress,addrSize,readerOpts);
  Own<capnp::EzRpcServer::Impl>::Own
            ((Own<capnp::EzRpcServer::Impl> *)this,this_00,
             (Disposer *)&_::HeapDisposer<capnp::EzRpcServer::Impl>::instance);
  capnp::Capability::Client::~Client(&local_40);
  OVar7.ptr = extraout_RDX;
  OVar7.disposer = (Disposer *)this;
  return OVar7;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}